

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O3

bool __thiscall COLLADASaxFWL::MeshLoader::initializePositionsOffset(MeshLoader *this)

{
  bool bVar1;
  InputShared *pIVar2;
  SourceBase *pSVar3;
  bool bVar4;
  String sourceId;
  URI inputUrl;
  String local_190;
  String local_170;
  String local_150;
  String local_130;
  URI local_110;
  
  local_110.mUriString._M_dataplus._M_p._0_4_ = 0xf;
  pIVar2 = MeshPrimitiveInputList::getInputBySemantic
                     (&this->mMeshPrimitiveInputs,(Semantic *)&local_110);
  if (pIVar2 == (InputShared *)0x0) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"No positions, can\'t import!","");
    bVar4 = IFilePartLoader::handleFWLError
                      ((IFilePartLoader *)this,ERROR_DATA_NOT_VALID,&local_130,SEVERITY_CRITICAL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    this->mPositionsOffset = pIVar2->mOffset;
    bVar4 = false;
  }
  COLLADABU::URI::URI(&local_110,&(pIVar2->super_InputUnshared).mSource,false);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,local_110.mFragment._M_dataplus._M_p,
             local_110.mFragment._M_dataplus._M_p + local_110.mFragment._M_string_length);
  pSVar3 = SourceArrayLoader::getSourceById(&this->super_SourceArrayLoader,&local_150);
  if (pSVar3 == (SourceBase *)0x0) {
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"Positions sourceBase is null.","");
    bVar1 = IFilePartLoader::handleFWLError
                      ((IFilePartLoader *)this,ERROR_DATA_NOT_VALID,&local_170,SEVERITY_CRITICAL);
    bVar4 = (bool)(bVar4 | bVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (pSVar3->mStride != 3) {
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_190,"Positios stride is not three.","");
      bVar1 = IFilePartLoader::handleFWLError
                        ((IFilePartLoader *)this,ERROR_DATA_NOT_VALID,&local_190,SEVERITY_CRITICAL);
      bVar4 = (bool)(bVar4 | bVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
    }
    this->mPositionsIndexOffset = (uint)pSVar3->mInitialIndex;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  COLLADABU::URI::~URI(&local_110);
  return bVar4;
}

Assistant:

bool MeshLoader::initializePositionsOffset ()
    {
        bool has_errors = false;
        const InputShared* positionInput = mMeshPrimitiveInputs.getPositionInput ();
        COLLADABU_ASSERT ( positionInput != 0 );
        if (positionInput == 0) {
            has_errors |= handleFWLError(SaxFWLError::ERROR_DATA_NOT_VALID, "No positions, can't import!", IError::SEVERITY_CRITICAL);
        }
        else {
            // Get the offset value, the initial index values and alloc the memory.
            mPositionsOffset = positionInput->getOffset();
        }

        COLLADABU::URI inputUrl = positionInput->getSource ();
        String sourceId = inputUrl.getFragment ();
        const SourceBase* sourceBase = getSourceById ( sourceId );
        COLLADABU_ASSERT ( sourceBase != 0 );
        if ( sourceBase == 0 )
            has_errors |= handleFWLError(SaxFWLError::ERROR_DATA_NOT_VALID, "Positions sourceBase is null.", IError::SEVERITY_CRITICAL);
        else {
            // only stride 3 makes sense for normals
            unsigned long long stride = sourceBase->getStride();
            if (stride != 3)
                has_errors |= handleFWLError(SaxFWLError::ERROR_DATA_NOT_VALID, "Positios stride is not three.", IError::SEVERITY_CRITICAL);

            mPositionsIndexOffset = (unsigned int)sourceBase->getInitialIndex();
        }
        return has_errors;
    }